

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall pugi::impl::anon_unknown_0::xpath_ast_node::is_posinv_expr(xpath_ast_node *this)

{
  bool bVar1;
  byte bVar2;
  xpath_ast_node *this_00;
  
  bVar2 = this->_type - 0x10;
  if ((bVar2 < 0x2a) && ((0x3000000007fU >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
    bVar2 = (byte)(0x3000000001f >> (bVar2 & 0x3f));
  }
  else {
    if (this->_left != (xpath_ast_node *)0x0) {
      bVar1 = is_posinv_expr(this->_left);
      if (!bVar1) {
        bVar2 = 0;
        goto LAB_0070eec3;
      }
    }
    for (this_00 = this->_right; bVar2 = this_00 == (xpath_ast_node *)0x0, !(bool)bVar2;
        this_00 = this_00->_next) {
      bVar1 = is_posinv_expr(this_00);
      if (!bVar1) break;
    }
  }
LAB_0070eec3:
  return (bool)(bVar2 & 1);
}

Assistant:

bool is_posinv_expr() const
		{
			switch (_type)
			{
			case ast_func_position:
			case ast_func_last:
				return false;

			case ast_string_constant:
			case ast_number_constant:
			case ast_variable:
				return true;

			case ast_step:
			case ast_step_root:
				return true;

			case ast_predicate:
			case ast_filter:
				return true;

			default:
				if (_left && !_left->is_posinv_expr()) return false;

				for (xpath_ast_node* n = _right; n; n = n->_next)
					if (!n->is_posinv_expr()) return false;

				return true;
			}
		}